

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmNinjaVars *this_01;
  int iVar2;
  cmGeneratorTarget *target;
  cmMakefile *pcVar3;
  pointer pcVar4;
  cmLocalNinjaGenerator *pcVar5;
  size_type sVar6;
  bool bVar7;
  cmGlobalNinjaGenerator *this_02;
  string *psVar8;
  string *psVar9;
  long *plVar10;
  cmGeneratedFileStream *pcVar11;
  char *pcVar12;
  size_t sVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  size_t sVar16;
  mapped_type *pmVar17;
  size_type *psVar18;
  size_type sVar19;
  cmOutputConverter *outputConverter;
  bool usedResponseFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string objPath;
  key_type local_2c8;
  TargetType local_2a4;
  cmNinjaLinkLineDeviceComputer *local_2a0;
  cmLocalNinjaGenerator *local_298;
  cmGlobalNinjaGenerator *local_290;
  key_type local_288;
  string cfgName;
  string frameworkPath;
  string cudaLinkLanguage;
  string targetOutputReal;
  string linkPath;
  cmNinjaBuild build;
  long *local_b0 [2];
  long local_a0 [2];
  string createRule;
  string local_70;
  string targetOutputImplib;
  
  this_02 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  paVar1 = &build.Comment.field_2;
  build.Comment._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&build,"CUDA","");
  local_290 = this_02;
  bVar7 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_02,&build.Comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)build.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    bVar7 = requireDeviceLinking
                      (target,(cmLocalGenerator *)
                              (this->super_cmNinjaTargetGenerator).LocalGenerator,
                       &(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        ConfigName);
    if (bVar7) {
      cudaLinkLanguage._M_dataplus._M_p = (pointer)&cudaLinkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cudaLinkLanguage,"CUDA","");
      pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      build.Comment._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&build,"CMAKE_CUDA_OUTPUT_EXTENSION","");
      psVar8 = cmMakefile::GetSafeDefinition(pcVar3,&build.Comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)build.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(build.Comment._M_dataplus._M_p,
                        build.Comment.field_2._M_allocated_capacity + 1);
      }
      psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
      pcVar4 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&cfgName,pcVar4,pcVar4 + psVar9->_M_string_length);
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      pcVar4 = (target->ObjectDirectory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&objPath,pcVar4,pcVar4 + (target->ObjectDirectory)._M_string_length);
      std::__cxx11::string::append((char *)&objPath);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&objPath,(ulong)(psVar8->_M_dataplus)._M_p);
      psVar18 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar18) {
        build.Comment.field_2._M_allocated_capacity = *psVar18;
        build.Comment.field_2._8_8_ = plVar10[3];
        build.Comment._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        build.Comment.field_2._M_allocated_capacity = *psVar18;
        build.Comment._M_dataplus._M_p = (pointer)*plVar10;
      }
      build.Comment._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputReal,&this->super_cmNinjaTargetGenerator,&build.Comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)build.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(build.Comment._M_dataplus._M_p,
                        build.Comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetFullPath(&build.Comment,target,&cfgName,ImportLibraryArtifact,false);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,&build.Comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)build.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(build.Comment._M_dataplus._M_p,
                        build.Comment.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
      pcVar11 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar11);
      local_2a4 = cmGeneratorTarget::GetType(target);
      pcVar11 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar11,"# Device Link build statements for ",0x23);
      pcVar12 = cmState::GetTargetTypeName(local_2a4);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)pcVar11 +
                        (int)(pcVar11->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             [-3]);
      }
      else {
        sVar13 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar11,pcVar12,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar11," target ",8);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&build.Comment,&this->super_cmNinjaTargetGenerator);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pcVar11,build.Comment._M_dataplus._M_p,
                           build.Comment._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)build.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(build.Comment._M_dataplus._M_p,
                        build.Comment.field_2._M_allocated_capacity + 1);
      }
      LanguageLinkerDeviceRule_abi_cxx11_(&local_70,this);
      build.Rule._M_dataplus._M_p = (pointer)&build.Rule.field_2;
      build.Comment._M_string_length = 0;
      build.Comment.field_2._M_allocated_capacity =
           build.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        build.Rule.field_2._8_8_ = local_70.field_2._8_8_;
      }
      else {
        build.Rule._M_dataplus._M_p = local_70._M_dataplus._M_p;
      }
      build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &build.Variables._M_t._M_impl.super__Rb_tree_header._M_header;
      build.Rule._M_string_length = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      build.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      build.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      build.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      build.RspFile._M_dataplus._M_p = (pointer)&build.RspFile.field_2;
      build.RspFile._M_string_length = 0;
      build.RspFile.field_2._M_local_buf[0] = '\0';
      build.Comment._M_dataplus._M_p = (pointer)paVar1;
      build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_replace((ulong)&build,0,(char *)0x0,0x4fc7a1);
      GetVisibleTypeName(this);
      std::__cxx11::string::append((char *)&build);
      std::__cxx11::string::append((char *)&build);
      std::__cxx11::string::_M_append((char *)&build,(ulong)targetOutputReal._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&build.Outputs,&targetOutputReal);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&frameworkPath,&(this->super_cmNinjaTargetGenerator).Objects);
      objPath.field_2._M_allocated_capacity =
           (size_type)
           build.ExplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objPath._M_string_length =
           (size_type)
           build.ExplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      objPath._M_dataplus._M_p =
           (pointer)build.ExplicitDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)frameworkPath._M_dataplus._M_p;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)frameworkPath._M_string_length;
      build.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)frameworkPath.field_2._M_allocated_capacity;
      frameworkPath._M_dataplus._M_p = (pointer)0x0;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&frameworkPath);
      psVar8 = &this->TargetLinkLanguage;
      cmNinjaTargetGenerator::ComputeLinkDeps
                ((cmNinjaDeps *)&frameworkPath,&this->super_cmNinjaTargetGenerator,psVar8);
      objPath.field_2._M_allocated_capacity =
           (size_type)
           build.ImplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objPath._M_string_length =
           (size_type)
           build.ImplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      objPath._M_dataplus._M_p =
           (pointer)build.ImplicitDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)frameworkPath._M_dataplus._M_p;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)frameworkPath._M_string_length;
      build.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)frameworkPath.field_2._M_allocated_capacity;
      frameworkPath._M_dataplus._M_p = (pointer)0x0;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&frameworkPath);
      frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity =
           frameworkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
      linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
      linkPath._M_string_length = 0;
      linkPath.field_2._M_local_buf[0] = '\0';
      psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cmGeneratorTarget::GetCreateRuleVariable(&createRule,target,psVar8,psVar9);
      pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&objPath,createRule._M_dataplus._M_p,
                 createRule._M_dataplus._M_p + createRule._M_string_length);
      std::__cxx11::string::append((char *)&objPath);
      bVar7 = cmMakefile::IsOn(pcVar3,&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      local_298 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      this_00 = &(local_298->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,&targetOutputReal,SHELL);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"TARGET_FILE","");
      this_01 = &build.Variables;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      local_2a0 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
      pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar5 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)pcVar5);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)&objPath,(cmStateSnapshot *)&usedResponseFile);
      cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
                (local_2a0,outputConverter,(cmStateDirectory *)&objPath,local_290);
      cmLinkLineComputer::SetUseWatcomQuote((cmLinkLineComputer *)local_2a0,bVar7);
      psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_LIBRARIES","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&objPath);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
      flags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_01,(key_type *)&usedResponseFile);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"LINK_FLAGS","");
      linkFlags = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&local_2c8);
      cmLocalGenerator::GetTargetFlags
                ((cmLocalGenerator *)local_298,(cmLinkLineComputer *)local_2a0,psVar9,pmVar15,flags,
                 linkFlags,&frameworkPath,&linkPath,target);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"JOB_POOL_LINK","");
      cmNinjaTargetGenerator::addPoolNinjaVariable
                (&this->super_cmNinjaTargetGenerator,&objPath,target,this_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      cmGlobalNinjaGenerator::EncodeLiteral(&objPath,pmVar15);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"LINK_FLAGS","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&local_2c8);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      cmCommonTargetGenerator::GetManifests_abi_cxx11_(&objPath,(cmCommonTargetGenerator *)this);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&objPath,&frameworkPath,&linkPath);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      if (local_2a4 == EXECUTABLE) {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        pcVar4 = (pmVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&objPath,pcVar4,pcVar4 + pmVar15->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar15);
      }
      else {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"ARCH_FLAGS","")
        ;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        pcVar4 = (pmVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&objPath,pcVar4,pcVar4 + pmVar15->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"ARCH_FLAGS","")
        ;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        objPath._M_string_length = 0;
        *objPath._M_dataplus._M_p = '\0';
        cmLocalGenerator::AddLanguageFlagsForLinking
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"LANGUAGE_COMPILE_FLAGS","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      bVar7 = cmGeneratorTarget::HasSOName(target,&cfgName);
      if (bVar7) {
        __s = cmMakefile::GetSONameFlag
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile
                         ,psVar8);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"SONAME_FLAG","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&objPath);
        pcVar12 = (char *)pmVar15->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)pmVar15,0,pcVar12,(ulong)__s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"SONAME","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&objPath);
        std::__cxx11::string::_M_assign((string *)pmVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if (local_2a4 == SHARED_LIBRARY) {
          cmGeneratorTarget::GetInstallNameDirForBuildTree
                    (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                              GeneratorTarget,&cfgName);
          if (objPath._M_string_length != 0) {
            cmOutputConverter::ConvertToOutputFormat
                      ((string *)&usedResponseFile,this_00,&objPath,SHELL);
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,"INSTALLNAME_DIR","");
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this_01,&local_2c8);
            std::__cxx11::string::operator=((string *)pmVar15,(string *)&usedResponseFile);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_usedResponseFile != &local_308) {
              operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)objPath._M_dataplus._M_p != &objPath.field_2) {
            operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,&targetOutputImplib,SHELL);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"TARGET_IMPLIB","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmNinjaTargetGenerator::EnsureParentDirectoryExists
                  (&this->super_cmNinjaTargetGenerator,&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
      }
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&local_2c8,&this->super_cmNinjaTargetGenerator,&objPath);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&usedResponseFile,
                 &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_2c8,SHELL);
      paVar1 = &local_288.field_2;
      local_288._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"OBJECT_DIR","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&local_288);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
      cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(&this->super_cmNinjaTargetGenerator,this_01);
      if (local_290->UsingGCCOnWindows == true) {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"LINK_LIBRARIES","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        sVar6 = pmVar15->_M_string_length;
        if (sVar6 != 0) {
          pcVar4 = (pmVar15->_M_dataplus)._M_p;
          sVar19 = 0;
          do {
            if (pcVar4[sVar19] == '\\') {
              pcVar4[sVar19] = '/';
            }
            sVar19 = sVar19 + 1;
          } while (sVar6 != sVar19);
        }
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        sVar6 = pmVar15->_M_string_length;
        if (sVar6 != 0) {
          pcVar4 = (pmVar15->_M_dataplus)._M_p;
          sVar19 = 0;
          do {
            if (pcVar4[sVar19] == '\\') {
              pcVar4[sVar19] = '/';
            }
            sVar19 = sVar19 + 1;
          } while (sVar6 != sVar19);
        }
      }
      sVar16 = cmSystemTools::CalculateCommandLineLengthLimit();
      LanguageLinkerDeviceRule_abi_cxx11_((string *)&usedResponseFile,this);
      pmVar17 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_290->RuleCmdLength,(key_type *)&usedResponseFile);
      iVar2 = *pmVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMakeFiles/","");
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_b0,(ulong)(psVar8->_M_dataplus)._M_p);
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_288.field_2._M_allocated_capacity = *psVar18;
        local_288.field_2._8_8_ = plVar10[3];
        local_288._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar18;
        local_288._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_288._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2c8.field_2._M_allocated_capacity = *psVar18;
        local_2c8.field_2._8_8_ = plVar10[3];
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *psVar18;
        local_2c8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_2c8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,&local_2c8);
      std::__cxx11::string::operator=((string *)&build.RspFile,(string *)&usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      cmLocalNinjaGenerator::AppendTargetDepends
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &build.OrderOnlyDeps,DependOnTargetArtifact);
      _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
      pcVar11 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (local_290,(ostream *)pcVar11,&build,(int)sVar16 - iVar2,&usedResponseFile);
      WriteDeviceLinkRule(this,usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      (*(local_2a0->super_cmLinkLineDeviceComputer).super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer[1])();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)createRule._M_dataplus._M_p != &createRule.field_2) {
        operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
        operator_delete(linkPath._M_dataplus._M_p,
                        CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                 linkPath.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        frameworkPath.field_2._M_allocated_capacity + 1);
      }
      cmNinjaBuild::~cmNinjaBuild(&build);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
        operator_delete(targetOutputImplib._M_dataplus._M_p,
                        targetOutputImplib.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
        operator_delete(targetOutputReal._M_dataplus._M_p,
                        targetOutputReal.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
        operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cudaLinkLanguage._M_dataplus._M_p != &cudaLinkLanguage.field_2) {
        operator_delete(cudaLinkLanguage._M_dataplus._M_p,
                        cudaLinkLanguage.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();
  if (!globalGen->GetLanguageEnabled("CUDA")) {
    return;
  }

  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->GetLocalGenerator(), this->ConfigName);
  if (!requiresDeviceLinking) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget->ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget->GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget->GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule());
  build.Comment = "Link the ";
  build.Comment += this->GetVisibleTypeName();
  build.Comment += " ";
  build.Comment += targetOutputReal;

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects();
  build.ImplicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget->GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      globalGen));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    localGen.AddLanguageFlagsForLinking(t, genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (genTarget->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  build.RspFile = this->ConvertToNinjaPath(std::string("CMakeFiles/") +
                                           genTarget->GetName() + ".rsp");

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 build.OrderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetBuildFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(usedResponseFile);
}